

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O0

CURLcode rtp_client_write(Curl_easy *data,char *ptr,size_t len)

{
  size_t sVar1;
  void *local_40;
  void *user_ptr;
  curl_write_callback writeit;
  size_t wrote;
  size_t len_local;
  char *ptr_local;
  Curl_easy *data_local;
  
  if (len == 0) {
    Curl_failf(data,"Cannot write a 0 size RTP packet.");
    data_local._4_4_ = CURLE_WRITE_ERROR;
  }
  else {
    if ((data->set).fwrite_rtp == (curl_write_callback)0x0) {
      user_ptr = (data->set).fwrite_func;
      local_40 = (data->set).out;
    }
    else {
      user_ptr = (data->set).fwrite_rtp;
      local_40 = (data->set).rtp_out;
    }
    Curl_set_in_callback(data,true);
    sVar1 = (*(code *)user_ptr)(ptr,1,len,local_40);
    Curl_set_in_callback(data,false);
    if (sVar1 == 0x10000001) {
      Curl_failf(data,"Cannot pause RTP");
      data_local._4_4_ = CURLE_WRITE_ERROR;
    }
    else if (sVar1 == len) {
      data_local._4_4_ = CURLE_OK;
    }
    else {
      Curl_failf(data,"Failed writing RTP data");
      data_local._4_4_ = CURLE_WRITE_ERROR;
    }
  }
  return data_local._4_4_;
}

Assistant:

static
CURLcode rtp_client_write(struct Curl_easy *data, const char *ptr, size_t len)
{
  size_t wrote;
  curl_write_callback writeit;
  void *user_ptr;

  if(len == 0) {
    failf(data, "Cannot write a 0 size RTP packet.");
    return CURLE_WRITE_ERROR;
  }

  /* If the user has configured CURLOPT_INTERLEAVEFUNCTION then use that
     function and any configured CURLOPT_INTERLEAVEDATA to write out the RTP
     data. Otherwise, use the CURLOPT_WRITEFUNCTION with the CURLOPT_WRITEDATA
     pointer to write out the RTP data. */
  if(data->set.fwrite_rtp) {
    writeit = data->set.fwrite_rtp;
    user_ptr = data->set.rtp_out;
  }
  else {
    writeit = data->set.fwrite_func;
    user_ptr = data->set.out;
  }

  Curl_set_in_callback(data, TRUE);
  wrote = writeit((char *)ptr, 1, len, user_ptr);
  Curl_set_in_callback(data, FALSE);

  if(CURL_WRITEFUNC_PAUSE == wrote) {
    failf(data, "Cannot pause RTP");
    return CURLE_WRITE_ERROR;
  }

  if(wrote != len) {
    failf(data, "Failed writing RTP data");
    return CURLE_WRITE_ERROR;
  }

  return CURLE_OK;
}